

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  BaseType BVar1;
  Decoration *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  CompilerError *this_00;
  mapped_type *pmVar9;
  SPIRType *type_00;
  BufferPackingStandard extraout_EDX;
  uint uVar10;
  uint32_t uVar11;
  CompilerGLSL *this_01;
  ulong uVar12;
  Bitset member_flags;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_78;
  undefined1 local_70 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  bVar3 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if (bVar3) {
    if (type->pointer == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Types in PhysicalStorageBufferEXT must be pointers.");
    }
    else {
      if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
        return 8;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                );
    }
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = this;
  bVar3 = Compiler::is_array(&this->super_Compiler,type);
  if (bVar3) {
    uVar4 = to_array_size_literal
                      (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
    uVar5 = type_to_packed_array_stride(this,type,flags,packing);
    uVar5 = uVar5 * uVar4;
    if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) {
      return uVar5;
    }
    if (type->basetype == Struct) {
      return uVar5;
    }
    uVar6 = type->width;
    uVar10 = type->vecsize;
    goto LAB_00250bb5;
  }
  if (type->basetype == Struct) {
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      uVar10 = 1;
      uVar12 = 0;
      uVar5 = 0;
      uVar4 = 1;
      do {
        pmVar9 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
        pDVar2 = (pmVar9->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        local_70 = (undefined1  [8])pDVar2[uVar12].decoration_flags.lower;
        local_78._M_h = (__hashtable_alloc *)(local_70 + 8);
        local_68._M_buckets = (__buckets_ptr)0x0;
        local_68._M_bucket_count = pDVar2[uVar12].decoration_flags.higher._M_h._M_bucket_count;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = pDVar2[uVar12].decoration_flags.higher._M_h._M_element_count;
        local_68._M_rehash_policy._M_max_load_factor =
             pDVar2[uVar12].decoration_flags.higher._M_h._M_rehash_policy._M_max_load_factor;
        local_68._M_rehash_policy._4_4_ =
             *(undefined4 *)&pDVar2[uVar12].decoration_flags.higher._M_h._M_rehash_policy.field_0x4;
        local_68._M_rehash_policy._M_next_resize =
             pDVar2[uVar12].decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_78._M_h,&pDVar2[uVar12].decoration_flags.higher._M_h,&local_78);
        type_00 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + (type->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar12].id);
        uVar7 = type_to_packed_alignment(this,type_00,(Bitset *)local_70,packing);
        BVar1 = type_00->basetype;
        uVar8 = type_to_packed_size(this,type_00,(Bitset *)local_70,packing);
        uVar11 = 1;
        if (BVar1 == Struct) {
          uVar11 = uVar7;
        }
        if (uVar4 < uVar7) {
          uVar4 = uVar7;
        }
        uVar5 = uVar8 + (-uVar4 & (uVar5 + uVar4) - 1);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_70 + 8));
        uVar12 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        uVar4 = uVar11;
      } while (uVar12 < (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      return uVar5;
    }
    return 0;
  }
  uVar4 = type_to_packed_base_size(this_01,type,extraout_EDX);
  if ((packing & ~BufferPackingStd430) == BufferPackingScalar) {
    return uVar4 * type->vecsize * type->columns;
  }
  uVar10 = type->vecsize;
  uVar6 = type->columns;
  uVar11 = uVar10 * uVar4;
  uVar5 = 0;
  if (uVar6 == 1) {
    uVar5 = uVar11;
  }
  uVar12 = flags->lower;
  if ((1 < uVar6 & (byte)((uVar12 & 0xffffffff) >> 5) & 7) == 1) {
    if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
      uVar5 = uVar4 * uVar6 * 4;
      goto LAB_00250db0;
    }
    if (uVar10 != 3) {
      uVar5 = uVar11 * uVar6;
      goto LAB_00250db0;
    }
    if ((uVar12 & 0x10) != 0) goto LAB_00250dbf;
    uVar5 = uVar4 * uVar6 * 4;
  }
  else {
LAB_00250db0:
    if (((byte)uVar12 >> 4 & 1 < uVar10) != 0) {
LAB_00250dbf:
      if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
         (uVar6 == 3)) {
        uVar5 = uVar11 * 4;
      }
      else {
        uVar5 = uVar11 * uVar6;
      }
    }
  }
  if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar6 < 2) {
    return uVar5;
  }
  uVar6 = type->width;
LAB_00250bb5:
  return uVar5 + (uVar6 >> 3) * (uVar10 - 4);
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (is_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (is_array(type))
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}